

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleBuffer.cpp
# Opt level: O1

void __thiscall
btTriangleBuffer::processTriangle
          (btTriangleBuffer *this,btVector3 *triangle,int partId,int triangleIndex)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  void *pvVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  
  uVar4 = *(undefined8 *)triangle->m_floats;
  uVar5 = *(undefined8 *)(triangle->m_floats + 2);
  uVar6 = *(undefined8 *)triangle[1].m_floats;
  uVar7 = *(undefined8 *)(triangle[1].m_floats + 2);
  uVar8 = *(undefined8 *)triangle[2].m_floats;
  uVar9 = *(undefined8 *)(triangle[2].m_floats + 2);
  iVar3 = *(int *)&this->field_0xc;
  if (iVar3 == *(int *)&this->field_0x10) {
    iVar18 = 1;
    if (iVar3 != 0) {
      iVar18 = iVar3 * 2;
    }
    if (*(int *)&this->field_0x10 < iVar18) {
      if (iVar18 == 0) {
        pvVar15 = (void *)0x0;
      }
      else {
        pvVar15 = btAlignedAllocInternal((long)iVar18 * 0x38,0x10);
      }
      iVar3 = *(int *)&this->field_0xc;
      if (0 < (long)iVar3) {
        lVar16 = 0;
        do {
          lVar17 = *(long *)&this->field_0x18;
          *(undefined8 *)((long)pvVar15 + lVar16 + 0x30) = *(undefined8 *)(lVar17 + 0x30 + lVar16);
          uVar10 = *(undefined8 *)(lVar17 + lVar16);
          uVar11 = ((undefined8 *)(lVar17 + lVar16))[1];
          puVar1 = (undefined8 *)(lVar17 + 0x10 + lVar16);
          uVar12 = *puVar1;
          uVar13 = puVar1[1];
          puVar1 = (undefined8 *)(lVar17 + 0x20 + lVar16);
          uVar14 = puVar1[1];
          puVar2 = (undefined8 *)((long)pvVar15 + lVar16 + 0x20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar14;
          puVar1 = (undefined8 *)((long)pvVar15 + lVar16 + 0x10);
          *puVar1 = uVar12;
          puVar1[1] = uVar13;
          *(undefined8 *)((long)pvVar15 + lVar16) = uVar10;
          ((undefined8 *)((long)pvVar15 + lVar16))[1] = uVar11;
          lVar16 = lVar16 + 0x38;
        } while ((long)iVar3 * 0x38 - lVar16 != 0);
      }
      if (*(void **)&this->field_0x18 != (void *)0x0) {
        if (this->field_0x20 == '\x01') {
          btAlignedFreeInternal(*(void **)&this->field_0x18);
        }
        *(undefined8 *)&this->field_0x18 = 0;
      }
      this->field_0x20 = 1;
      *(void **)&this->field_0x18 = pvVar15;
      *(int *)&this->field_0x10 = iVar18;
    }
  }
  lVar16 = *(long *)&this->field_0x18;
  lVar17 = (long)*(int *)&this->field_0xc * 0x38;
  puVar1 = (undefined8 *)(lVar16 + 0x20 + lVar17);
  *puVar1 = uVar8;
  puVar1[1] = uVar9;
  puVar1 = (undefined8 *)(lVar16 + 0x10 + lVar17);
  *puVar1 = uVar6;
  puVar1[1] = uVar7;
  *(undefined8 *)(lVar16 + lVar17) = uVar4;
  ((undefined8 *)(lVar16 + lVar17))[1] = uVar5;
  *(int *)(lVar16 + 0x30 + lVar17) = partId;
  *(int *)(lVar16 + 0x34 + lVar17) = triangleIndex;
  *(int *)&this->field_0xc = *(int *)&this->field_0xc + 1;
  return;
}

Assistant:

void btTriangleBuffer::processTriangle(btVector3* triangle,int partId,int  triangleIndex)
{
		btTriangle	tri;
		tri.m_vertex0 = triangle[0];
		tri.m_vertex1 = triangle[1];
		tri.m_vertex2 = triangle[2];
		tri.m_partId = partId;
		tri.m_triangleIndex = triangleIndex;
			
		m_triangleBuffer.push_back(tri);
}